

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  ulong uVar5;
  secp256k1_scratch_space *scratch;
  long lVar6;
  code *pcVar7;
  byte bVar8;
  secp256k1_scalar *psVar9;
  long extraout_RDX;
  secp256k1_scratch *scratch_00;
  size_t sVar10;
  secp256k1_gej *r;
  uint uVar11;
  ulong uVar12;
  secp256k1_strauss_point_state *psVar13;
  secp256k1_scalar *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_scratch *scratch_01;
  secp256k1_gej *psVar16;
  secp256k1_sha256 *hash;
  secp256k1_ge *elem;
  code *cb;
  secp256k1_fe *unaff_R12;
  secp256k1_sha256 *acc;
  secp256k1_ge *unaff_R13;
  ulong uVar17;
  secp256k1_scalar *psVar18;
  uint uVar19;
  secp256k1_gej *psVar20;
  bool bVar21;
  ulong uStack_2400;
  secp256k1_strauss_state sStack_23f8;
  secp256k1_strauss_point_state sStack_23e0;
  secp256k1_fe asStack_1fd0 [8];
  secp256k1_ge asStack_1e50 [8];
  size_t *psStack_1b08;
  secp256k1_gej *psStack_1b00;
  secp256k1_scalar *psStack_1af8;
  secp256k1_sha256 *psStack_1af0;
  secp256k1_gej *psStack_1ae8;
  secp256k1_strauss_point_state *psStack_1ae0;
  size_t sStack_1ad0;
  size_t sStack_1ac0;
  secp256k1_scratch asStack_1ab8 [2];
  secp256k1_scalar sStack_1a68;
  secp256k1_ge sStack_1a48;
  secp256k1_gej sStack_19e0;
  secp256k1_gej sStack_1948;
  secp256k1_gej sStack_18b0;
  secp256k1_gej sStack_1818;
  secp256k1_gej sStack_1780;
  secp256k1_gej asStack_16e8 [2];
  secp256k1_gej asStack_1568 [5];
  secp256k1_strauss_point_state sStack_1228;
  secp256k1_scratch_space *psStack_e10;
  secp256k1_sha256 *psStack_e08;
  secp256k1_scalar *psStack_e00;
  secp256k1_gej *psStack_df8;
  secp256k1_gej *psStack_df0;
  secp256k1_scalar *psStack_de8;
  undefined4 uStack_dd6;
  undefined2 uStack_dd2;
  secp256k1_gej *psStack_dd0;
  long lStack_dc8;
  secp256k1_scalar sStack_dc0;
  secp256k1_scalar sStack_da0;
  secp256k1_sha256 sStack_d80;
  secp256k1_sha256 sStack_d10;
  secp256k1_gej *psStack_ca8;
  secp256k1_fe *psStack_ca0;
  secp256k1_ge *psStack_c98;
  secp256k1_ge *psStack_c90;
  secp256k1_gej *psStack_c88;
  secp256k1_strauss_point_state *psStack_c80;
  undefined1 auStack_c78 [32];
  undefined1 auStack_c58 [40];
  secp256k1_ge *psStack_c30;
  secp256k1_strauss_point_state *psStack_c28;
  secp256k1_gej sStack_c20;
  secp256k1_gej sStack_b88;
  secp256k1_gej sStack_af0;
  secp256k1_ge sStack_a58;
  secp256k1_gej sStack_9f0;
  secp256k1_fe asStack_958 [8];
  secp256k1_ge asStack_7d8 [8];
  secp256k1_strauss_point_state sStack_498;
  int *piStack_80;
  
  if (((s->d[1] == 0 && s->d[2] == 0) && s->d[3] == 0) && s->d[0] == 0) {
    uVar5 = (long)(w + 0x7f) / (long)w;
    if ((int)uVar5 < 1) {
      return 0;
    }
    memset(wnaf,0,(uVar5 & 0xffffffff) << 2);
    return 0;
  }
  if ((uint)w < 0x20) {
    uVar19 = (uint)s->d[0];
    uVar11 = ~uVar19 & 1;
    bVar8 = (byte)w;
    *wnaf = (~(uint)(-1L << (bVar8 & 0x3f)) & uVar19) + uVar11;
    uVar19 = (byte)(((short)w + 0x7fU & 0xff) / (ushort)bVar8) - 1;
    uVar17 = (ulong)uVar19;
    uVar19 = 0x80 - uVar19 * w;
    uVar5 = uVar17;
    while( true ) {
      uVar1 = w;
      if (uVar5 == uVar17) {
        uVar1 = uVar19;
      }
      uVar1 = secp256k1_scalar_get_bits_var(s,(int)uVar5 * w,uVar1);
      if (uVar1 != 0) break;
      wnaf[uVar5] = 0;
      bVar21 = (long)uVar5 < 2;
      uVar5 = uVar5 - 1;
      if (bVar21) {
        return uVar11;
      }
    }
    if ((long)uVar5 < 1) {
      return uVar11;
    }
    iVar2 = -1 << (bVar8 & 0x1f);
    uVar12 = 1;
    uVar1 = w;
    do {
      uVar3 = w;
      if (uVar17 == uVar12) {
        uVar3 = uVar19;
      }
      uVar3 = secp256k1_scalar_get_bits_var(s,uVar1,uVar3);
      if ((uVar3 & 1) == 0) {
        wnaf[uVar12 - 1] = wnaf[uVar12 - 1] + iVar2;
        uVar3 = uVar3 | 1;
      }
      wnaf[uVar12] = uVar3;
      if (1 < uVar12) {
        if (wnaf[uVar12 - 1] == -1) {
          if (0 < wnaf[uVar12 - 2]) {
            iVar4 = wnaf[uVar12 - 2] + iVar2;
            goto LAB_00158e65;
          }
        }
        else if ((wnaf[uVar12 - 1] == 1) && (wnaf[uVar12 - 2] < 0)) {
          iVar4 = wnaf[uVar12 - 2] + (1 << (bVar8 & 0x1f));
LAB_00158e65:
          wnaf[uVar12 - 2] = iVar4;
          wnaf[uVar12 - 1] = 0;
        }
      }
      uVar12 = uVar12 + 1;
      uVar1 = uVar1 + w;
      if ((int)uVar5 + 1 == uVar12) {
        return uVar11;
      }
    } while( true );
  }
  psVar14 = (secp256k1_scalar *)wnaf;
  secp256k1_wnaf_fixed_cold_1();
  uVar5 = 0x20;
  do {
    uVar19 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar19;
    if (*(int *)((long)psVar14->d + uVar5 * 4) != 0) {
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_00158ec8;
    }
  } while (8 < uVar19);
  uVar19 = 7;
  while (*(int *)((long)psVar14->d + (ulong)uVar19 * 4) == *(int *)((long)s->d + (ulong)uVar19 * 4))
  {
    bVar21 = uVar19 == 0;
    uVar19 = uVar19 - 1;
    if (bVar21) {
      return extraout_EAX;
    }
  }
LAB_00158ec8:
  test_fixed_wnaf_small_helper_cold_2();
  psVar20 = (secp256k1_gej *)auStack_c78;
  psVar13 = (secp256k1_strauss_point_state *)((ulong)s & 0xffffffff);
  psVar18 = (secp256k1_scalar *)auStack_c58;
  psStack_c80 = (secp256k1_strauss_point_state *)0x158ef0;
  piStack_80 = wnaf;
  random_scalar_order_test(psVar18);
  psStack_c80 = (secp256k1_strauss_point_state *)0x158f01;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_c78,psVar18,psVar14);
  psStack_c80 = (secp256k1_strauss_point_state *)0x158f0c;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_c78,(secp256k1_scalar *)auStack_c78);
  if ((int)s == 0) {
    psStack_c80 = (secp256k1_strauss_point_state *)0x159005;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_af0,(secp256k1_scalar *)auStack_c58);
    psStack_c80 = (secp256k1_strauss_point_state *)0x15901c;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b88,(secp256k1_scalar *)auStack_c78);
    psStack_c80 = (secp256k1_strauss_point_state *)0x159030;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_c20,psVar14);
  }
  else {
    psStack_c80 = (secp256k1_strauss_point_state *)0x158f24;
    random_group_element_test(&sStack_a58);
    psStack_c80 = (secp256k1_strauss_point_state *)0x158f34;
    secp256k1_gej_set_ge(&sStack_9f0,&sStack_a58);
    if ((int)s == 1) {
      unaff_R12 = asStack_958;
      unaff_R13 = asStack_7d8;
      psVar13 = &sStack_498;
      psVar18 = &test_ecmult_target::zero;
      psStack_c80 = (secp256k1_strauss_point_state *)0x158f94;
      sStack_b88.x.n[0] = (uint64_t)unaff_R12;
      sStack_b88.x.n[1] = (uint64_t)unaff_R13;
      sStack_b88.x.n[2] = (uint64_t)psVar13;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_b88,&sStack_af0,1,&sStack_9f0,
                 (secp256k1_scalar *)auStack_c58,&test_ecmult_target::zero);
      psStack_c80 = (secp256k1_strauss_point_state *)0x158fbf;
      sStack_c20.x.n[0] = (uint64_t)unaff_R12;
      sStack_c20.x.n[1] = (uint64_t)unaff_R13;
      sStack_c20.x.n[2] = (uint64_t)psVar13;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_c20,&sStack_b88,1,&sStack_9f0,
                 (secp256k1_scalar *)auStack_c78,&test_ecmult_target::zero);
      psStack_c80 = (secp256k1_strauss_point_state *)0x158fe7;
      auStack_c58._32_8_ = unaff_R12;
      psStack_c30 = unaff_R13;
      psStack_c28 = psVar13;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_c58 + 0x20),&sStack_c20,1,&sStack_9f0,psVar14,
                 &test_ecmult_target::zero);
      psVar20 = &sStack_9f0;
    }
    else {
      psVar18 = (secp256k1_scalar *)&sStack_a58;
      psStack_c80 = (secp256k1_strauss_point_state *)0x15904f;
      secp256k1_ecmult_const(&sStack_af0,(secp256k1_ge *)psVar18,(secp256k1_scalar *)auStack_c58);
      psStack_c80 = (secp256k1_strauss_point_state *)0x159062;
      secp256k1_ecmult_const(&sStack_b88,(secp256k1_ge *)psVar18,(secp256k1_scalar *)auStack_c78);
      psStack_c80 = (secp256k1_strauss_point_state *)0x159072;
      secp256k1_ecmult_const(&sStack_c20,(secp256k1_ge *)psVar18,psVar14);
      psVar20 = (secp256k1_gej *)auStack_c78;
    }
  }
  psStack_c80 = (secp256k1_strauss_point_state *)0x15908c;
  secp256k1_gej_add_var(&sStack_c20,&sStack_c20,&sStack_af0,(secp256k1_fe *)0x0);
  psStack_c80 = (secp256k1_strauss_point_state *)0x1590a1;
  psVar15 = &sStack_c20;
  secp256k1_gej_add_var(&sStack_c20,&sStack_c20,&sStack_b88,(secp256k1_fe *)0x0);
  psStack_c80 = (secp256k1_strauss_point_state *)0x1590a9;
  psVar16 = &sStack_c20;
  secp256k1_gej_verify(&sStack_c20);
  if (sStack_c20.infinity != 0) {
    return extraout_EAX_00;
  }
  psStack_c80 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  psVar14 = (secp256k1_scalar *)((ulong)psVar16 & 0xffffffff);
  psStack_de8 = (secp256k1_scalar *)0x1590f7;
  psStack_dd0 = psVar15;
  lStack_dc8 = extraout_RDX;
  psStack_ca8 = &sStack_c20;
  psStack_ca0 = unaff_R12;
  psStack_c98 = unaff_R13;
  psStack_c90 = (secp256k1_ge *)psVar18;
  psStack_c88 = psVar20;
  psStack_c80 = psVar13;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_dd6 = SUB84(psVar16,0);
  acc = &sStack_d10;
  sStack_d10.s[0] = 0x6a09e667;
  sStack_d10.s[1] = 0xbb67ae85;
  sStack_d10.s[2] = 0x3c6ef372;
  sStack_d10.s[3] = 0xa54ff53a;
  sStack_d10.s[4] = 0x510e527f;
  sStack_d10.s[5] = 0x9b05688c;
  sStack_d10.s[6] = 0x1f83d9ab;
  sStack_d10.s[7] = 0x5be0cd19;
  psVar15 = (secp256k1_gej *)0x0;
  sStack_d10.bytes = 0;
  sStack_da0.d[0] = 0;
  sStack_da0.d[1] = 0;
  sStack_da0.d[2] = 0;
  sStack_da0.d[3] = 0;
  psStack_de8 = (secp256k1_scalar *)0x159147;
  test_ecmult_accumulate(acc,&sStack_da0,scratch);
  sStack_da0.d[0] = 1;
  sStack_da0.d[1] = 0;
  sStack_da0.d[2] = 0;
  sStack_da0.d[3] = 0;
  psStack_de8 = (secp256k1_scalar *)0x159169;
  test_ecmult_accumulate(acc,&sStack_da0,scratch);
  psStack_de8 = (secp256k1_scalar *)0x159174;
  secp256k1_scalar_negate(&sStack_da0,&sStack_da0);
  psStack_de8 = (secp256k1_scalar *)0x159185;
  test_ecmult_accumulate(acc,&sStack_da0,scratch);
  psVar20 = psStack_dd0;
  if (psStack_dd0 != (secp256k1_gej *)0x0) {
    psVar15 = (secp256k1_gej *)0x0;
    acc = &sStack_d80;
    psVar14 = &sStack_dc0;
    do {
      uStack_dd2 = SUB82(psVar15,0);
      sStack_d80.s[0] = 0x6a09e667;
      sStack_d80.s[1] = 0xbb67ae85;
      sStack_d80.s[2] = 0x3c6ef372;
      sStack_d80.s[3] = 0xa54ff53a;
      sStack_d80.s[4] = 0x510e527f;
      sStack_d80.s[5] = 0x9b05688c;
      sStack_d80.s[6] = 0x1f83d9ab;
      sStack_d80.s[7] = 0x5be0cd19;
      sStack_d80.bytes = 0;
      psStack_de8 = (secp256k1_scalar *)0x1591e1;
      secp256k1_sha256_write(acc,(uchar *)&uStack_dd6,6);
      psStack_de8 = (secp256k1_scalar *)0x1591ec;
      secp256k1_sha256_finalize(acc,(uchar *)psVar14);
      psStack_de8 = (secp256k1_scalar *)0x1591f9;
      secp256k1_scalar_set_b32(&sStack_da0,(uchar *)psVar14,(int *)0x0);
      psStack_de8 = (secp256k1_scalar *)0x15920c;
      test_ecmult_accumulate(&sStack_d10,&sStack_da0,scratch);
      psVar15 = (secp256k1_gej *)((long)(psVar15->x).n + 1);
    } while (psVar20 != psVar15);
  }
  hash = &sStack_d10;
  psVar18 = &sStack_dc0;
  psStack_de8 = (secp256k1_scalar *)0x159226;
  secp256k1_sha256_finalize(hash,(uchar *)psVar18);
  lVar6 = 0;
  while (*(char *)((long)sStack_dc0.d + lVar6) == *(char *)(lStack_dc8 + lVar6)) {
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x20) {
      psStack_de8 = (secp256k1_scalar *)0x15924e;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return extraout_EAX_01;
    }
  }
  psStack_de8 = (secp256k1_scalar *)test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_df0 = psVar20;
  sStack_1a68.d[2] = 0;
  sStack_1a68.d[3] = 0;
  sStack_1a68.d[0] = 0;
  sStack_1a68.d[1] = 0;
  sStack_1ac0 = 0x41;
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x1592b0;
  psStack_e10 = scratch;
  psStack_e08 = acc;
  psStack_e00 = &sStack_da0;
  psStack_df8 = psVar15;
  psStack_de8 = psVar14;
  secp256k1_gej_set_ge(&sStack_1948,&secp256k1_ge_const_g);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x1592bd;
  secp256k1_gej_set_infinity(&sStack_19e0);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x1592d4;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1780,psVar18);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x15931f;
  sStack_18b0.x.n[0] = (uint64_t)asStack_16e8;
  sStack_18b0.x.n[1] = (uint64_t)asStack_1568;
  sStack_18b0.x.n[2] = (uint64_t)&sStack_1228;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_18b0,&sStack_1818,1,&sStack_1948,psVar18,
             &sStack_1a68);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x159355;
  sStack_1a48.x.n[0] = (uint64_t)asStack_16e8;
  sStack_1a48.x.n[1] = (uint64_t)asStack_1568;
  sStack_1a48.x.n[2] = (uint64_t)&sStack_1228;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1a48,&sStack_18b0,1,&sStack_19e0,&sStack_1a68,
             psVar18);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x15937b;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch_00,(secp256k1_gej *)&sStack_1228,psVar18,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x1593a5;
  psVar14 = psVar18;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch_00,asStack_1568,&sStack_1a68,
             test_ecmult_accumulate_cb,psVar18,1);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x1593bf;
  secp256k1_ecmult_const(asStack_16e8,&secp256k1_ge_const_g,psVar18);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x1593d7;
  secp256k1_ge_set_gej_var(&sStack_1a48,&sStack_1780);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x1593e7;
  ge_equals_gej(&sStack_1a48,&sStack_1818);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x1593f2;
  ge_equals_gej(&sStack_1a48,&sStack_18b0);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x1593fd;
  ge_equals_gej(&sStack_1a48,(secp256k1_gej *)&sStack_1228);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x159408;
  ge_equals_gej(&sStack_1a48,asStack_1568);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x159413;
  ge_equals_gej(&sStack_1a48,asStack_16e8);
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x15941b;
  secp256k1_ge_verify(&sStack_1a48);
  if (sStack_1a48.infinity == 0) {
    elem = &sStack_1a48;
    scratch_01 = asStack_1ab8;
    psVar18 = (secp256k1_scalar *)0x0;
    psStack_1ae0 = (secp256k1_strauss_point_state *)0x159457;
    secp256k1_eckey_pubkey_serialize(elem,scratch_01->magic,&sStack_1ac0,0);
    if (sStack_1ac0 != 0x41) {
      psStack_1ae0 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      psStack_1b08 = &sStack_1ac0;
      psStack_1b00 = asStack_16e8;
      psStack_1af8 = &sStack_1a68;
      psStack_1af0 = hash;
      psStack_1ae8 = &sStack_18b0;
      psStack_1ae0 = &sStack_1228;
      secp256k1_gej_set_infinity(r);
      if (psVar18 != (secp256k1_scalar *)0x0 || sStack_1ad0 != 0) {
        if (sStack_1ad0 == 0) {
          sStack_23f8.aux = asStack_1fd0;
          sStack_23f8.pre_a = asStack_1e50;
          sStack_23f8.ps = &sStack_23e0;
          secp256k1_ecmult_strauss_wnaf(&sStack_23f8,r,1,r,&secp256k1_scalar_zero,psVar18);
        }
        else {
          if ((scratch_01 == (secp256k1_scratch *)0x0) ||
             (sVar10 = secp256k1_pippenger_max_points((secp256k1_callback *)elem,scratch_01),
             sVar10 == 0)) {
LAB_001596b0:
            iVar2 = secp256k1_ecmult_multi_simple_var(r,psVar18,cb,psVar14,sStack_1ad0);
            return iVar2;
          }
          uVar5 = 5000000;
          if (sVar10 < 5000000) {
            uVar5 = sVar10;
          }
          uVar17 = sStack_1ad0 - 1;
          uStack_2400 = uVar17 / uVar5 + 1;
          uVar5 = uVar17 / uStack_2400;
          if (uVar5 < 0x57) {
            lVar6 = 0;
            do {
              if (scratch_01->magic[lVar6] != "scratch"[lVar6]) {
                (*(code *)(elem->x).n[0])("invalid scratch space",(elem->x).n[1]);
                goto LAB_001596b0;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != 8);
            uVar12 = scratch_01->max_size - scratch_01->alloc_size;
            uVar5 = 0;
            if (0x4a < uVar12) {
              uVar5 = uVar12 - 0x4b;
            }
            if (uVar5 < 0x988) goto LAB_001596b0;
            uVar5 = uVar5 / 0x988;
            if (4999999 < uVar5) {
              uVar5 = 5000000;
            }
            uStack_2400 = uVar17 / uVar5 + 1;
            uVar5 = uVar17 / uStack_2400;
            pcVar7 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar7 = secp256k1_ecmult_pippenger_batch;
          }
          uVar5 = uVar5 + 1;
          lVar6 = 0;
          uVar17 = 0;
          do {
            uVar12 = uVar5;
            if (sStack_1ad0 < uVar5) {
              uVar12 = sStack_1ad0;
            }
            psVar9 = (secp256k1_scalar *)0x0;
            if (uVar17 == 0) {
              psVar9 = psVar18;
            }
            iVar2 = (*pcVar7)(elem,scratch_01,&sStack_23e0,psVar9,cb,psVar14,uVar12,lVar6);
            if (iVar2 == 0) {
              return 0;
            }
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_23e0,(secp256k1_fe *)0x0);
            sStack_1ad0 = sStack_1ad0 - uVar12;
            uVar17 = uVar17 + 1;
            lVar6 = lVar6 + uVar5;
          } while (uStack_2400 != uVar17);
        }
      }
      return 1;
    }
    sVar10 = 0x41;
  }
  else {
    asStack_1ab8[0].magic[0] = '\0';
    sVar10 = 1;
  }
  psStack_1ae0 = (secp256k1_strauss_point_state *)0x15946f;
  secp256k1_sha256_write(hash,asStack_1ab8[0].magic,sVar10);
  return extraout_EAX_02;
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}